

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void push_sorted_suite::push_alternating(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_60 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  iterator last;
  array<int,_4UL> storage;
  
  memset(&last,0,0x10);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  *pvVar1 = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_sorted<int*>(pvVar2,pvVar1 + 1);
  expect_1._M_elems[2] = 0xb;
  expect_1._M_elems[3] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x4ca,"void push_sorted_suite::push_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[1] = 0x2c;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_sorted<int*>(pvVar2,pvVar1 + 2);
  expect_2._M_elems[2] = 0xb;
  expect_2._M_elems[3] = 0x2c;
  expect_1._M_elems[0] = 0;
  expect_1._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x4d1,"void push_sorted_suite::push_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[2] = 0x16;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_sorted<int*>(pvVar2,pvVar1 + 3);
  expect_3._M_elems[2] = 0xb;
  expect_3._M_elems[3] = 0x16;
  expect_2._M_elems[0] = 0x2c;
  expect_2._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x4d8,"void push_sorted_suite::push_alternating()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[3] = 0x21;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_sorted<int*>(pvVar2,pvVar1 + 4);
  local_60._0_4_ = 0xb;
  local_60._4_4_ = 0x16;
  expect_3._M_elems[0] = 0x21;
  expect_3._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_60);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_60);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x4df,"void push_sorted_suite::push_alternating()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void push_alternating()
{
    std::array<int, 4> storage = { 0, 0, 0, 0 };
    auto last = storage.begin();
    *last++ = 11;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 44, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}